

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::ObjectIntersector1<true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  float fVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  uint uVar8;
  Geometry *this;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  bool bVar27;
  bool bVar28;
  int iVar29;
  AABBNodeMB4D *node1;
  ulong uVar30;
  ulong in_R8;
  ulong *puVar31;
  byte bVar32;
  long lVar33;
  byte bVar34;
  ulong uVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 in_ZMM7 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong local_2378;
  undefined4 local_2370;
  ulong local_2368 [1127];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  local_2370 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar52 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar7 = (context->query_radius).field_0;
    auVar51 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
    auVar52 = ZEXT1664(auVar51);
  }
  puVar31 = local_2368;
  fVar2 = (query->p).field_0.field_0.x;
  auVar49._4_4_ = fVar2;
  auVar49._0_4_ = fVar2;
  auVar49._8_4_ = fVar2;
  auVar49._12_4_ = fVar2;
  auVar49._16_4_ = fVar2;
  auVar49._20_4_ = fVar2;
  auVar49._24_4_ = fVar2;
  auVar49._28_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.y;
  auVar50._4_4_ = fVar3;
  auVar50._0_4_ = fVar3;
  auVar50._8_4_ = fVar3;
  auVar50._12_4_ = fVar3;
  auVar50._16_4_ = fVar3;
  auVar50._20_4_ = fVar3;
  auVar50._24_4_ = fVar3;
  auVar50._28_4_ = fVar3;
  fVar4 = (query->p).field_0.field_0.z;
  auVar53._4_4_ = fVar4;
  auVar53._0_4_ = fVar4;
  auVar53._8_4_ = fVar4;
  auVar53._12_4_ = fVar4;
  auVar53._16_4_ = fVar4;
  auVar53._20_4_ = fVar4;
  auVar53._24_4_ = fVar4;
  auVar53._28_4_ = fVar4;
  uVar5 = *(undefined4 *)&(context->query_radius).field_0;
  auVar44._4_4_ = uVar5;
  auVar44._0_4_ = uVar5;
  auVar44._8_4_ = uVar5;
  auVar44._12_4_ = uVar5;
  auVar44._16_4_ = uVar5;
  auVar44._20_4_ = uVar5;
  auVar44._24_4_ = uVar5;
  auVar44._28_4_ = uVar5;
  uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar46._4_4_ = uVar5;
  auVar46._0_4_ = uVar5;
  auVar46._8_4_ = uVar5;
  auVar46._12_4_ = uVar5;
  auVar46._16_4_ = uVar5;
  auVar46._20_4_ = uVar5;
  auVar46._24_4_ = uVar5;
  auVar46._28_4_ = uVar5;
  uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar36._4_4_ = uVar5;
  auVar36._0_4_ = uVar5;
  auVar36._8_4_ = uVar5;
  auVar36._12_4_ = uVar5;
  auVar36._16_4_ = uVar5;
  auVar36._20_4_ = uVar5;
  auVar36._24_4_ = uVar5;
  auVar36._28_4_ = uVar5;
  bVar28 = false;
  auVar13 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar54 = ZEXT3264(auVar13);
  auVar55 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    auVar13 = vsubps_avx(auVar49,auVar44);
    auVar9 = vsubps_avx(auVar50,auVar46);
    auVar10 = vsubps_avx(auVar53,auVar36);
    auVar47._0_4_ = fVar4 + auVar36._0_4_;
    auVar47._4_4_ = fVar4 + auVar36._4_4_;
    auVar47._8_4_ = fVar4 + auVar36._8_4_;
    auVar47._12_4_ = fVar4 + auVar36._12_4_;
    auVar47._16_4_ = fVar4 + auVar36._16_4_;
    auVar47._20_4_ = fVar4 + auVar36._20_4_;
    auVar47._24_4_ = fVar4 + auVar36._24_4_;
    auVar47._28_4_ = fVar4 + auVar36._28_4_;
    auVar36 = vmulps_avx512vl(auVar44,auVar44);
    auVar51 = auVar52._0_16_;
    do {
      do {
        do {
          if (puVar31 == &local_2378) {
            return bVar28;
          }
          pfVar1 = (float *)(puVar31 + -1);
          puVar31 = puVar31 + -2;
        } while (auVar52._0_4_ < *pfVar1);
        uVar35 = *puVar31;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar35 & 8) == 0) {
              uVar30 = uVar35 & 0xfffffffffffffff0;
              fVar6 = query->time;
              auVar45._4_4_ = fVar6;
              auVar45._0_4_ = fVar6;
              auVar45._8_4_ = fVar6;
              auVar45._12_4_ = fVar6;
              auVar45._16_4_ = fVar6;
              auVar45._20_4_ = fVar6;
              auVar45._24_4_ = fVar6;
              auVar45._28_4_ = fVar6;
              auVar21 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x100),auVar45,
                                        *(undefined1 (*) [32])(uVar30 + 0x40));
              auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x140),auVar45,
                                        *(undefined1 (*) [32])(uVar30 + 0x80));
              auVar23 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x180),auVar45,
                                        *(undefined1 (*) [32])(uVar30 + 0xc0));
              auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x120),auVar45,
                                        *(undefined1 (*) [32])(uVar30 + 0x60));
              auVar25 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x160),auVar45,
                                        *(undefined1 (*) [32])(uVar30 + 0xa0));
              auVar26 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x1a0),auVar45,
                                        *(undefined1 (*) [32])(uVar30 + 0xe0));
              auVar39 = vmaxps_avx(auVar49,ZEXT1632(auVar21));
              auVar39 = vminps_avx(auVar39,ZEXT1632(auVar24));
              auVar11 = vsubps_avx(auVar39,auVar49);
              auVar39 = vmaxps_avx(auVar50,ZEXT1632(auVar22));
              auVar39 = vminps_avx(auVar39,ZEXT1632(auVar25));
              auVar37 = vsubps_avx(auVar39,auVar50);
              auVar39 = vmaxps_avx(auVar53,ZEXT1632(auVar23));
              auVar39 = vminps_avx(auVar39,ZEXT1632(auVar26));
              auVar39 = vsubps_avx(auVar39,auVar53);
              auVar42._0_4_ =
                   auVar11._0_4_ * auVar11._0_4_ + auVar37._0_4_ * auVar37._0_4_ +
                   auVar39._0_4_ * auVar39._0_4_;
              auVar42._4_4_ =
                   auVar11._4_4_ * auVar11._4_4_ + auVar37._4_4_ * auVar37._4_4_ +
                   auVar39._4_4_ * auVar39._4_4_;
              auVar42._8_4_ =
                   auVar11._8_4_ * auVar11._8_4_ + auVar37._8_4_ * auVar37._8_4_ +
                   auVar39._8_4_ * auVar39._8_4_;
              auVar42._12_4_ =
                   auVar11._12_4_ * auVar11._12_4_ + auVar37._12_4_ * auVar37._12_4_ +
                   auVar39._12_4_ * auVar39._12_4_;
              auVar42._16_4_ =
                   auVar11._16_4_ * auVar11._16_4_ + auVar37._16_4_ * auVar37._16_4_ +
                   auVar39._16_4_ * auVar39._16_4_;
              auVar42._20_4_ =
                   auVar11._20_4_ * auVar11._20_4_ + auVar37._20_4_ * auVar37._20_4_ +
                   auVar39._20_4_ * auVar39._20_4_;
              auVar42._24_4_ =
                   auVar11._24_4_ * auVar11._24_4_ + auVar37._24_4_ * auVar37._24_4_ +
                   auVar39._24_4_ * auVar39._24_4_;
              auVar42._28_4_ = auVar37._28_4_ + 0.0 + auVar39._28_4_;
              in_ZMM7 = ZEXT3264(auVar42);
              uVar14 = vcmpps_avx512vl(auVar42,auVar36,2);
              uVar15 = vcmpps_avx512vl(ZEXT1632(auVar21),ZEXT1632(auVar24),2);
              bVar34 = (byte)uVar14 & (byte)uVar15;
              if (((uint)uVar35 & 7) == 6) {
                uVar14 = vcmpps_avx512vl(auVar45,*(undefined1 (*) [32])(uVar30 + 0x1c0),0xd);
                uVar15 = vcmpps_avx512vl(auVar45,*(undefined1 (*) [32])(uVar30 + 0x1e0),1);
                bVar34 = (byte)uVar14 & (byte)uVar15 & bVar34;
              }
              in_R8 = CONCAT44((int)(in_R8 >> 0x20),(uint)bVar34);
            }
          }
          else if ((uVar35 & 8) == 0) {
            uVar30 = uVar35 & 0xfffffffffffffff0;
            fVar6 = query->time;
            auVar38._4_4_ = fVar6;
            auVar38._0_4_ = fVar6;
            auVar38._8_4_ = fVar6;
            auVar38._12_4_ = fVar6;
            auVar38._16_4_ = fVar6;
            auVar38._20_4_ = fVar6;
            auVar38._24_4_ = fVar6;
            auVar38._28_4_ = fVar6;
            auVar21 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x100),auVar38,
                                      *(undefined1 (*) [32])(uVar30 + 0x40));
            auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x140),auVar38,
                                      *(undefined1 (*) [32])(uVar30 + 0x80));
            auVar23 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x180),auVar38,
                                      *(undefined1 (*) [32])(uVar30 + 0xc0));
            auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x120),auVar38,
                                      *(undefined1 (*) [32])(uVar30 + 0x60));
            auVar25 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x160),auVar38,
                                      *(undefined1 (*) [32])(uVar30 + 0xa0));
            auVar26 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x1a0),auVar38,
                                      *(undefined1 (*) [32])(uVar30 + 0xe0));
            auVar39 = vmaxps_avx(auVar49,ZEXT1632(auVar21));
            auVar39 = vminps_avx(auVar39,ZEXT1632(auVar24));
            auVar11 = vsubps_avx(auVar39,auVar49);
            auVar39 = vmaxps_avx(auVar50,ZEXT1632(auVar22));
            auVar39 = vminps_avx(auVar39,ZEXT1632(auVar25));
            auVar37 = vsubps_avx(auVar39,auVar50);
            auVar39 = vmaxps_avx(auVar53,ZEXT1632(auVar23));
            auVar39 = vminps_avx(auVar39,ZEXT1632(auVar26));
            auVar39 = vsubps_avx(auVar39,auVar53);
            in_ZMM7 = ZEXT3264(CONCAT428(auVar37._28_4_ + auVar37._28_4_ + auVar11._28_4_,
                                         CONCAT424(auVar39._24_4_ * auVar39._24_4_ +
                                                   auVar37._24_4_ * auVar37._24_4_ +
                                                   auVar11._24_4_ * auVar11._24_4_,
                                                   CONCAT420(auVar39._20_4_ * auVar39._20_4_ +
                                                             auVar37._20_4_ * auVar37._20_4_ +
                                                             auVar11._20_4_ * auVar11._20_4_,
                                                             CONCAT416(auVar39._16_4_ *
                                                                       auVar39._16_4_ +
                                                                       auVar37._16_4_ *
                                                                       auVar37._16_4_ +
                                                                       auVar11._16_4_ *
                                                                       auVar11._16_4_,
                                                                       CONCAT412(auVar39._12_4_ *
                                                                                 auVar39._12_4_ +
                                                                                 auVar37._12_4_ *
                                                                                 auVar37._12_4_ +
                                                                                 auVar11._12_4_ *
                                                                                 auVar11._12_4_,
                                                                                 CONCAT48(auVar39.
                                                  _8_4_ * auVar39._8_4_ +
                                                  auVar37._8_4_ * auVar37._8_4_ +
                                                  auVar11._8_4_ * auVar11._8_4_,
                                                  CONCAT44(auVar39._4_4_ * auVar39._4_4_ +
                                                           auVar37._4_4_ * auVar37._4_4_ +
                                                           auVar11._4_4_ * auVar11._4_4_,
                                                           auVar39._0_4_ * auVar39._0_4_ +
                                                           auVar37._0_4_ * auVar37._0_4_ +
                                                           auVar11._0_4_ * auVar11._0_4_))))))));
            uVar14 = vcmpps_avx512vl(ZEXT1632(auVar21),ZEXT1632(auVar24),2);
            uVar15 = vcmpps_avx512vl(ZEXT1632(auVar24),auVar13,1);
            auVar11._4_4_ = fVar2 + auVar44._4_4_;
            auVar11._0_4_ = fVar2 + auVar44._0_4_;
            auVar11._8_4_ = fVar2 + auVar44._8_4_;
            auVar11._12_4_ = fVar2 + auVar44._12_4_;
            auVar11._16_4_ = fVar2 + auVar44._16_4_;
            auVar11._20_4_ = fVar2 + auVar44._20_4_;
            auVar11._24_4_ = fVar2 + auVar44._24_4_;
            auVar11._28_4_ = fVar2 + auVar44._28_4_;
            uVar16 = vcmpps_avx512vl(ZEXT1632(auVar21),auVar11,6);
            uVar17 = vcmpps_avx512vl(ZEXT1632(auVar25),auVar9,1);
            auVar39._4_4_ = fVar3 + auVar46._4_4_;
            auVar39._0_4_ = fVar3 + auVar46._0_4_;
            auVar39._8_4_ = fVar3 + auVar46._8_4_;
            auVar39._12_4_ = fVar3 + auVar46._12_4_;
            auVar39._16_4_ = fVar3 + auVar46._16_4_;
            auVar39._20_4_ = fVar3 + auVar46._20_4_;
            auVar39._24_4_ = fVar3 + auVar46._24_4_;
            auVar39._28_4_ = fVar3 + auVar46._28_4_;
            uVar18 = vcmpps_avx512vl(ZEXT1632(auVar22),auVar39,6);
            uVar19 = vcmpps_avx512vl(ZEXT1632(auVar26),auVar10,1);
            uVar20 = vcmpps_avx512vl(ZEXT1632(auVar23),auVar47,6);
            bVar34 = ~((byte)uVar18 | (byte)uVar16 | (byte)uVar20 | (byte)uVar15 |
                      (byte)uVar17 | (byte)uVar19) & (byte)uVar14;
            in_R8 = (ulong)bVar34;
            if (((uint)uVar35 & 7) == 6) {
              uVar14 = vcmpps_avx512vl(auVar38,*(undefined1 (*) [32])(uVar30 + 0x1e0),1);
              uVar15 = vcmpps_avx512vl(auVar38,*(undefined1 (*) [32])(uVar30 + 0x1c0),0xd);
              in_R8 = (ulong)((byte)uVar14 & (byte)uVar15 & bVar34);
            }
          }
          if ((uVar35 & 8) == 0) {
            if (in_R8 == 0) {
              iVar29 = 4;
            }
            else {
              auVar39 = *(undefined1 (*) [32])(uVar35 & 0xfffffffffffffff0);
              auVar11 = ((undefined1 (*) [32])(uVar35 & 0xfffffffffffffff0))[1];
              auVar45 = in_ZMM7._0_32_;
              auVar37 = vpternlogd_avx512vl(auVar54._0_32_,auVar45,auVar55._0_32_,0xf8);
              uVar35 = in_R8 & 0xffffffff;
              auVar38 = vpcompressd_avx512vl(auVar37);
              bVar27 = (bool)((byte)uVar35 & 1);
              auVar41._0_4_ = (uint)bVar27 * auVar38._0_4_ | (uint)!bVar27 * auVar37._0_4_;
              bVar27 = (bool)((byte)(uVar35 >> 1) & 1);
              auVar41._4_4_ = (uint)bVar27 * auVar38._4_4_ | (uint)!bVar27 * auVar37._4_4_;
              bVar27 = (bool)((byte)(uVar35 >> 2) & 1);
              auVar41._8_4_ = (uint)bVar27 * auVar38._8_4_ | (uint)!bVar27 * auVar37._8_4_;
              bVar27 = (bool)((byte)(uVar35 >> 3) & 1);
              auVar41._12_4_ = (uint)bVar27 * auVar38._12_4_ | (uint)!bVar27 * auVar37._12_4_;
              bVar27 = (bool)((byte)(uVar35 >> 4) & 1);
              auVar41._16_4_ = (uint)bVar27 * auVar38._16_4_ | (uint)!bVar27 * auVar37._16_4_;
              bVar27 = (bool)((byte)(uVar35 >> 5) & 1);
              auVar41._20_4_ = (uint)bVar27 * auVar38._20_4_ | (uint)!bVar27 * auVar37._20_4_;
              bVar27 = (bool)((byte)(uVar35 >> 6) & 1);
              auVar41._24_4_ = (uint)bVar27 * auVar38._24_4_ | (uint)!bVar27 * auVar37._24_4_;
              bVar27 = (bool)((byte)(uVar35 >> 7) & 1);
              auVar41._28_4_ = (uint)bVar27 * auVar38._28_4_ | (uint)!bVar27 * auVar37._28_4_;
              auVar37 = vpermt2q_avx512vl(auVar39,auVar41,auVar11);
              uVar35 = auVar37._0_8_;
              iVar29 = 0;
              uVar30 = in_R8 - 1 & in_R8;
              if (uVar30 != 0) {
                auVar37 = vpshufd_avx2(auVar41,0x55);
                vpermt2q_avx512vl(auVar39,auVar37,auVar11);
                auVar38 = vpminsd_avx2(auVar41,auVar37);
                auVar37 = vpmaxsd_avx2(auVar41,auVar37);
                uVar30 = uVar30 - 1 & uVar30;
                if (uVar30 == 0) {
                  auVar38 = vpermi2q_avx512vl(auVar38,auVar39,auVar11);
                  uVar35 = auVar38._0_8_;
                  auVar39 = vpermt2q_avx512vl(auVar39,auVar37,auVar11);
                  *puVar31 = auVar39._0_8_;
                  auVar39 = vpermd_avx2(auVar37,auVar45);
                  *(int *)(puVar31 + 1) = auVar39._0_4_;
                  puVar31 = puVar31 + 2;
                }
                else {
                  auVar43 = vpshufd_avx2(auVar41,0xaa);
                  vpermt2q_avx512vl(auVar39,auVar43,auVar11);
                  auVar42 = vpminsd_avx2(auVar38,auVar43);
                  auVar38 = vpmaxsd_avx2(auVar38,auVar43);
                  auVar43 = vpminsd_avx2(auVar37,auVar38);
                  auVar37 = vpmaxsd_avx2(auVar37,auVar38);
                  uVar30 = uVar30 - 1 & uVar30;
                  if (uVar30 == 0) {
                    auVar38 = vpermi2q_avx512vl(auVar42,auVar39,auVar11);
                    uVar35 = auVar38._0_8_;
                    auVar38 = vpermt2q_avx512vl(auVar39,auVar37,auVar11);
                    *puVar31 = auVar38._0_8_;
                    auVar37 = vpermd_avx2(auVar37,auVar45);
                    *(int *)(puVar31 + 1) = auVar37._0_4_;
                    auVar39 = vpermt2q_avx512vl(auVar39,auVar43,auVar11);
                    puVar31[2] = auVar39._0_8_;
                    auVar39 = vpermd_avx2(auVar43,auVar45);
                    *(int *)(puVar31 + 3) = auVar39._0_4_;
                    puVar31 = puVar31 + 4;
                  }
                  else {
                    auVar38 = vpshufd_avx2(auVar41,0xff);
                    vpermt2q_avx512vl(auVar39,auVar38,auVar11);
                    auVar12 = vpminsd_avx2(auVar42,auVar38);
                    auVar38 = vpmaxsd_avx2(auVar42,auVar38);
                    auVar42 = vpminsd_avx2(auVar43,auVar38);
                    auVar38 = vpmaxsd_avx2(auVar43,auVar38);
                    auVar43 = vpminsd_avx2(auVar37,auVar38);
                    auVar37 = vpmaxsd_avx2(auVar37,auVar38);
                    uVar30 = uVar30 - 1 & uVar30;
                    if (uVar30 == 0) {
                      auVar38 = vpermi2q_avx512vl(auVar12,auVar39,auVar11);
                      uVar35 = auVar38._0_8_;
                      auVar38 = vpermt2q_avx512vl(auVar39,auVar37,auVar11);
                      *puVar31 = auVar38._0_8_;
                      auVar37 = vpermd_avx2(auVar37,auVar45);
                      *(int *)(puVar31 + 1) = auVar37._0_4_;
                      auVar37 = vpermt2q_avx512vl(auVar39,auVar43,auVar11);
                      puVar31[2] = auVar37._0_8_;
                      auVar37 = vpermd_avx2(auVar43,auVar45);
                      *(int *)(puVar31 + 3) = auVar37._0_4_;
                      auVar39 = vpermt2q_avx512vl(auVar39,auVar42,auVar11);
                      puVar31[4] = auVar39._0_8_;
                      auVar39 = vpermd_avx2(auVar42,auVar45);
                      *(int *)(puVar31 + 5) = auVar39._0_4_;
                      puVar31 = puVar31 + 6;
                    }
                    else {
                      auVar40 = valignd_avx512vl(auVar41,auVar41,3);
                      auVar38 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                      auVar41 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar38,auVar12);
                      auVar38 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar42 = vpermt2d_avx512vl(auVar41,auVar38,auVar42);
                      auVar42 = vpermt2d_avx512vl(auVar42,auVar38,auVar43);
                      auVar38 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar37 = vpermt2d_avx512vl(auVar42,auVar38,auVar37);
                      auVar48 = ZEXT3264(auVar37);
                      uVar35 = uVar30;
                      do {
                        auVar38 = auVar48._0_32_;
                        auVar37._8_4_ = 1;
                        auVar37._0_8_ = 0x100000001;
                        auVar37._12_4_ = 1;
                        auVar37._16_4_ = 1;
                        auVar37._20_4_ = 1;
                        auVar37._24_4_ = 1;
                        auVar37._28_4_ = 1;
                        auVar37 = vpermd_avx2(auVar37,auVar40);
                        auVar40 = valignd_avx512vl(auVar40,auVar40,1);
                        vpermt2q_avx512vl(auVar39,auVar40,auVar11);
                        uVar35 = uVar35 - 1 & uVar35;
                        uVar14 = vpcmpd_avx512vl(auVar37,auVar38,5);
                        auVar37 = vpmaxsd_avx2(auVar37,auVar38);
                        bVar34 = (byte)uVar14 << 1;
                        auVar38 = valignd_avx512vl(auVar38,auVar38,7);
                        bVar27 = (bool)((byte)uVar14 & 1);
                        auVar43._4_4_ = (uint)bVar27 * auVar38._4_4_ | (uint)!bVar27 * auVar37._4_4_
                        ;
                        auVar43._0_4_ = auVar37._0_4_;
                        bVar27 = (bool)(bVar34 >> 2 & 1);
                        auVar43._8_4_ = (uint)bVar27 * auVar38._8_4_ | (uint)!bVar27 * auVar37._8_4_
                        ;
                        bVar27 = (bool)(bVar34 >> 3 & 1);
                        auVar43._12_4_ =
                             (uint)bVar27 * auVar38._12_4_ | (uint)!bVar27 * auVar37._12_4_;
                        bVar27 = (bool)(bVar34 >> 4 & 1);
                        auVar43._16_4_ =
                             (uint)bVar27 * auVar38._16_4_ | (uint)!bVar27 * auVar37._16_4_;
                        bVar27 = (bool)(bVar34 >> 5 & 1);
                        auVar43._20_4_ =
                             (uint)bVar27 * auVar38._20_4_ | (uint)!bVar27 * auVar37._20_4_;
                        bVar27 = (bool)(bVar34 >> 6 & 1);
                        auVar43._24_4_ =
                             (uint)bVar27 * auVar38._24_4_ | (uint)!bVar27 * auVar37._24_4_;
                        auVar43._28_4_ =
                             (uint)(bVar34 >> 7) * auVar38._28_4_ |
                             (uint)!(bool)(bVar34 >> 7) * auVar37._28_4_;
                        auVar48 = ZEXT3264(auVar43);
                      } while (uVar35 != 0);
                      lVar33 = POPCOUNT(uVar30) + 3;
                      do {
                        auVar37 = vpermi2q_avx512vl(auVar43,auVar39,auVar11);
                        *puVar31 = auVar37._0_8_;
                        auVar38 = auVar48._0_32_;
                        auVar37 = vpermd_avx2(auVar38,auVar45);
                        *(int *)(puVar31 + 1) = auVar37._0_4_;
                        auVar43 = valignd_avx512vl(auVar38,auVar38,1);
                        puVar31 = puVar31 + 2;
                        auVar48 = ZEXT3264(auVar43);
                        lVar33 = lVar33 + -1;
                      } while (lVar33 != 0);
                      auVar39 = vpermt2q_avx512vl(auVar39,auVar43,auVar11);
                      uVar35 = auVar39._0_8_;
                    }
                    in_ZMM7 = ZEXT3264(auVar45);
                    iVar29 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar29 = 6;
          }
        } while (iVar29 == 0);
      } while ((iVar29 != 6) || (uVar30 = (ulong)((uint)uVar35 & 0xf), uVar30 == 8));
      lVar33 = 0;
      bVar34 = 0;
      do {
        bVar32 = bVar34;
        uVar8 = *(uint *)((uVar35 & 0xfffffffffffffff0) + lVar33 * 8);
        this = (context->scene->geometries).items[uVar8].ptr;
        context->geomID = uVar8;
        context->primID = *(uint *)((uVar35 & 0xfffffffffffffff0) + 4 + lVar33 * 8);
        bVar27 = Geometry::pointQuery(this,query,context);
        lVar33 = lVar33 + 1;
        bVar34 = bVar32 | bVar27;
      } while (uVar30 - 8 != lVar33);
      auVar52 = ZEXT1664(auVar51);
      auVar39 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar54 = ZEXT3264(auVar39);
      auVar55 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      in_ZMM7 = ZEXT3264(in_ZMM7._0_32_);
    } while (bVar32 == 0 && !bVar27);
    uVar5 = *(undefined4 *)&(context->query_radius).field_0;
    auVar44._4_4_ = uVar5;
    auVar44._0_4_ = uVar5;
    auVar44._8_4_ = uVar5;
    auVar44._12_4_ = uVar5;
    auVar44._16_4_ = uVar5;
    auVar44._20_4_ = uVar5;
    auVar44._24_4_ = uVar5;
    auVar44._28_4_ = uVar5;
    uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar46._4_4_ = uVar5;
    auVar46._0_4_ = uVar5;
    auVar46._8_4_ = uVar5;
    auVar46._12_4_ = uVar5;
    auVar46._16_4_ = uVar5;
    auVar46._20_4_ = uVar5;
    auVar46._24_4_ = uVar5;
    auVar46._28_4_ = uVar5;
    uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar36._4_4_ = uVar5;
    auVar36._0_4_ = uVar5;
    auVar36._8_4_ = uVar5;
    auVar36._12_4_ = uVar5;
    auVar36._16_4_ = uVar5;
    auVar36._20_4_ = uVar5;
    auVar36._24_4_ = uVar5;
    auVar36._28_4_ = uVar5;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar52 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar7 = (context->query_radius).field_0;
      auVar51 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
      auVar52 = ZEXT1664(auVar51);
    }
    bVar28 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }